

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::iterate
          (ConcurrentSSBOAtomicCounterMixedCase *this)

{
  glUseProgramFunc p_Var1;
  int iVar2;
  deUint32 dVar3;
  GLenum err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_7c8;
  int local_644;
  MessageBuilder local_640;
  int local_4bc;
  MessageBuilder local_4b8;
  deUint32 local_338;
  int local_334;
  deUint32 result;
  int callNdx;
  MessageBuilder local_1a0;
  Functions *local_20;
  Functions *gl;
  ConcurrentSSBOAtomicCounterMixedCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_20 = (Functions *)CONCAT44(extraout_var,iVar2);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [88])
                      "Testing atomic counters and SSBO atomic operations with both backed by the same buffer."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&result,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&result,
                      (char (*) [56])"Running SSBO atomic program and atomic counter program ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_numCalls);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [23])" times. (interleaved)\n");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"Num groups = (");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_workSize);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", 1, 1)\n");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&result);
  (*local_20->bindBufferBase)(0x90d2,1,this->m_bufferID);
  (*local_20->bindBufferBase)(0x92c0,2,this->m_bufferID);
  for (local_334 = 0; local_334 < this->m_numCalls; local_334 = local_334 + 1) {
    p_Var1 = local_20->useProgram;
    dVar3 = glu::ShaderProgram::getProgram(this->m_atomicCounterProgram);
    (*p_Var1)(dVar3);
    (*local_20->dispatchCompute)(this->m_workSize,1,1);
    p_Var1 = local_20->useProgram;
    dVar3 = glu::ShaderProgram::getProgram(this->m_ssboAtomicProgram);
    (*p_Var1)(dVar3);
    (*local_20->dispatchCompute)(this->m_workSize,1,1);
  }
  err = (*local_20->getError)();
  glu::checkError(err,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xc04);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_4b8,(char (*) [37])"Verifying work buffer, it should be ");
  local_4bc = this->m_numCalls * this->m_workSize;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4bc);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b8);
  (*local_20->bindBuffer)(0x92c0,this->m_bufferID);
  local_338 = readBufferUint32(local_20,0x92c0);
  if (local_338 == this->m_numCalls * this->m_workSize) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_7c8,(char (*) [17])"Buffer is valid.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7c8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_640,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_640,(char (*) [36])"Buffer value error, expected value ");
    local_644 = this->m_numCalls * this->m_workSize;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_644);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2c67b94);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_338);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_640);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Buffer contents invalid");
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ConcurrentSSBOAtomicCounterMixedCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing atomic counters and SSBO atomic operations with both backed by the same buffer." << tcu::TestLog::EndMessage;

	// invoke programs N times
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running SSBO atomic program and atomic counter program " << m_numCalls << " times. (interleaved)\n"
			<< "Num groups = (" << m_workSize << ", 1, 1)\n"
			<< tcu::TestLog::EndMessage;

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_bufferID);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_bufferID);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.useProgram(m_atomicCounterProgram->getProgram());
			gl.dispatchCompute(m_workSize, 1, 1);

			gl.useProgram(m_ssboAtomicProgram->getProgram());
			gl.dispatchCompute(m_workSize, 1, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		deUint32 result;

		// XORs cancel out, only addition is left
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work buffer, it should be " << m_numCalls*m_workSize << tcu::TestLog::EndMessage;

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_bufferID);
		result = readBufferUint32(gl, GL_ATOMIC_COUNTER_BUFFER);

		if ((int)result != m_numCalls*m_workSize)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Buffer value error, expected value " << (m_numCalls*m_workSize) << ", got " << result << "\n"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Buffer is valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}